

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demux.c
# Opt level: O3

ParseStatus ParseVP8X(WebPDemuxer *dmux)

{
  size_t sVar1;
  byte bVar2;
  uint8_t uVar3;
  ushort uVar4;
  undefined2 uVar5;
  int iVar6;
  uint32_t uVar7;
  uint8_t *puVar8;
  size_t sVar9;
  Frame *pFVar10;
  bool bVar11;
  uint uVar12;
  uint uVar13;
  Chunk *pCVar14;
  size_t sVar15;
  Frame *frame;
  uint uVar16;
  int iVar17;
  uint uVar18;
  ParseStatus PVar19;
  MemBuffer *mem;
  size_t sVar20;
  uint uVar21;
  ParseStatus PVar22;
  ulong uVar23;
  
  sVar20 = (dmux->mem_).start_;
  sVar15 = (dmux->mem_).end_;
  if (7 < sVar15 - sVar20) {
    dmux->is_ext_format_ = 1;
    (dmux->mem_).start_ = sVar20 + 4;
    puVar8 = (dmux->mem_).buf_;
    uVar21 = *(uint *)(puVar8 + sVar20 + 4);
    sVar1 = sVar20 + 8;
    (dmux->mem_).start_ = sVar1;
    if (uVar21 + 9 < 0x13) {
      return PARSE_ERROR;
    }
    uVar21 = (uVar21 & 1) + uVar21;
    sVar9 = (dmux->mem_).riff_end_;
    if (sVar9 - sVar1 < (ulong)uVar21) {
      return PARSE_ERROR;
    }
    if ((ulong)uVar21 <= sVar15 - sVar1) {
      dmux->feature_flags_ = (uint)puVar8[sVar20 + 8];
      (dmux->mem_).start_ = sVar20 + 0xc;
      uVar4 = *(ushort *)(puVar8 + sVar20 + 0xc);
      bVar2 = puVar8[sVar20 + 0xe];
      (dmux->mem_).start_ = sVar20 + 0xf;
      uVar12 = (uint)uVar4 + (uint)bVar2 * 0x10000 + 1;
      dmux->canvas_width_ = uVar12;
      uVar4 = *(ushort *)(puVar8 + sVar20 + 0xf);
      bVar2 = puVar8[sVar20 + 0x11];
      (dmux->mem_).start_ = sVar20 + 0x12;
      uVar16 = (uint)bVar2 * 0x10000 + (uint)uVar4 + 1;
      dmux->canvas_height_ = uVar16;
      if ((int)((ulong)uVar12 * (ulong)uVar16 >> 0x20) != 0) {
        return PARSE_ERROR;
      }
      sVar20 = sVar20 + 0x12 + (ulong)(uVar21 - 10);
      (dmux->mem_).start_ = sVar20;
      dmux->state_ = WEBP_DEMUX_PARSED_HEADER;
      if (sVar9 - sVar20 < 8) {
        return PARSE_ERROR;
      }
      if (sVar15 - sVar20 < 8) {
        return PARSE_NEED_MORE_DATA;
      }
      uVar21 = dmux->feature_flags_;
      sVar20 = (dmux->mem_).start_;
      bVar11 = false;
      do {
        puVar8 = (dmux->mem_).buf_;
        iVar6 = *(int *)(puVar8 + sVar20);
        (dmux->mem_).start_ = sVar20 + 4;
        uVar12 = *(uint *)(puVar8 + sVar20 + 4);
        sVar15 = sVar20 + 8;
        (dmux->mem_).start_ = sVar15;
        if (0xfffffff6 < (ulong)uVar12) {
          return PARSE_ERROR;
        }
        uVar16 = (uVar12 & 1) + uVar12;
        uVar23 = (ulong)uVar16;
        if ((dmux->mem_).riff_end_ - sVar15 < uVar23) {
          return PARSE_ERROR;
        }
        if (iVar6 < 0x48504c41) {
          if (iVar6 < 0x46495845) {
            if (iVar6 == 0x20385056) {
LAB_00107460:
              if (bVar11) {
                return PARSE_ERROR;
              }
              if ((uVar21 & 2) != 0) {
                return PARSE_ERROR;
              }
              (dmux->mem_).start_ = sVar20;
              PVar19 = ParseSingleImage(dmux);
              bVar11 = false;
              goto LAB_0010759e;
            }
            if (iVar6 != 0x20504d58) goto LAB_0010753a;
            iVar17 = 2;
          }
          else {
            if (iVar6 != 0x46495845) {
              if (iVar6 != 0x464d4e41) goto LAB_0010753a;
              if (!bVar11) {
                return PARSE_ERROR;
              }
              bVar11 = true;
              PVar19 = PARSE_ERROR;
              if (0xf < uVar16) {
                if ((dmux->mem_).end_ - sVar15 < 0x10) {
                  PVar19 = PARSE_NEED_MORE_DATA;
                }
                else {
                  uVar12 = dmux->feature_flags_;
                  frame = (Frame *)WebPSafeCalloc(1,0x50);
                  if (frame != (Frame *)0x0) {
                    sVar20 = (dmux->mem_).start_;
                    puVar8 = (dmux->mem_).buf_;
                    uVar4 = *(ushort *)(puVar8 + sVar20);
                    bVar2 = puVar8[sVar20 + 2];
                    (dmux->mem_).start_ = sVar20 + 3;
                    frame->x_offset_ = (uint)bVar2 * 0x20000 + (uint)uVar4 * 2;
                    uVar4 = *(ushort *)(puVar8 + sVar20 + 3);
                    bVar2 = puVar8[sVar20 + 5];
                    (dmux->mem_).start_ = sVar20 + 6;
                    frame->y_offset_ = (uint)bVar2 * 0x20000 + (uint)uVar4 * 2;
                    uVar4 = *(ushort *)(puVar8 + sVar20 + 6);
                    bVar2 = puVar8[sVar20 + 8];
                    (dmux->mem_).start_ = sVar20 + 9;
                    uVar13 = (uint)uVar4 + (uint)bVar2 * 0x10000 + 1;
                    frame->width_ = uVar13;
                    uVar4 = *(ushort *)(puVar8 + sVar20 + 9);
                    bVar2 = puVar8[sVar20 + 0xb];
                    (dmux->mem_).start_ = sVar20 + 0xc;
                    uVar18 = (uint)uVar4 + (uint)bVar2 * 0x10000 + 1;
                    frame->height_ = uVar18;
                    uVar5 = *(undefined2 *)(puVar8 + sVar20 + 0xc);
                    uVar3 = puVar8[sVar20 + 0xe];
                    (dmux->mem_).start_ = sVar20 + 0xf;
                    frame->duration_ = (uint)CONCAT12(uVar3,uVar5);
                    bVar2 = puVar8[sVar20 + 0xf];
                    (dmux->mem_).start_ = sVar20 + 0x10;
                    frame->dispose_method_ = bVar2 & WEBP_MUX_DISPOSE_BACKGROUND;
                    frame->blend_method_ = bVar2 >> 1 & WEBP_MUX_NO_BLEND;
                    if ((int)((ulong)uVar13 * (ulong)uVar18 >> 0x20) == 0) {
                      PVar19 = StoreFrame(dmux->num_frames_ + 1,uVar16 - 0x10,&dmux->mem_,frame);
                      PVar22 = PARSE_ERROR;
                      if (PVar19 != PARSE_ERROR) {
                        PVar22 = PVar19;
                        if ((ulong)(uVar16 - 0x10) < (dmux->mem_).start_ - (sVar20 + 0x10)) {
                          PVar22 = PARSE_ERROR;
                        }
                        if (((PVar22 != PARSE_ERROR) && ((uVar12 & 2) != 0)) &&
                           (PVar22 = PVar19, 0 < frame->frame_num_)) {
                          pFVar10 = *dmux->frames_tail_;
                          if ((pFVar10 == (Frame *)0x0) ||
                             (PVar22 = PARSE_ERROR, pFVar10->complete_ != 0)) {
                            *dmux->frames_tail_ = frame;
                            frame->next_ = (Frame *)0x0;
                            dmux->frames_tail_ = &frame->next_;
                            dmux->num_frames_ = dmux->num_frames_ + 1;
                            goto LAB_0010759e;
                          }
                        }
                      }
                      PVar19 = PVar22;
                      WebPSafeFree(frame);
                    }
                    else {
                      WebPSafeFree(frame);
                    }
                  }
                }
              }
              goto LAB_0010759e;
            }
            iVar17 = 3;
          }
LAB_001074e6:
          PVar19 = PARSE_NEED_MORE_DATA;
          if ((dmux->mem_).end_ - sVar15 < uVar23) goto LAB_0010759e;
          if ((dmux->feature_flags_ >> iVar17 & 1) != 0) {
LAB_0010754b:
            pCVar14 = (Chunk *)WebPSafeCalloc(1,0x18);
            if (pCVar14 == (Chunk *)0x0) {
              return PARSE_ERROR;
            }
            (pCVar14->data_).offset_ = sVar20;
            (pCVar14->data_).size_ = (ulong)uVar12 + 8;
            *dmux->chunks_tail_ = pCVar14;
            pCVar14->next_ = (Chunk *)0x0;
            dmux->chunks_tail_ = &pCVar14->next_;
            sVar15 = (dmux->mem_).start_;
          }
LAB_00107596:
          (dmux->mem_).start_ = sVar15 + uVar23;
LAB_0010759c:
          PVar19 = PARSE_OK;
        }
        else if (iVar6 < 0x4d494e41) {
          if ((iVar6 == 0x48504c41) || (iVar6 == 0x4c385056)) goto LAB_00107460;
LAB_0010753a:
          PVar19 = PARSE_NEED_MORE_DATA;
          if (uVar23 <= (dmux->mem_).end_ - sVar15) goto LAB_0010754b;
        }
        else {
          if (iVar6 != 0x4d494e41) {
            iVar17 = 5;
            if (iVar6 == 0x50434349) goto LAB_001074e6;
            if (iVar6 == 0x58385056) {
              return PARSE_ERROR;
            }
            goto LAB_0010753a;
          }
          if (uVar16 < 6) {
            return PARSE_ERROR;
          }
          PVar19 = PARSE_NEED_MORE_DATA;
          if (uVar23 <= (dmux->mem_).end_ - sVar15) {
            if (bVar11) {
              if (uVar23 <= (dmux->mem_).end_ - sVar15) goto LAB_00107596;
              goto LAB_0010759e;
            }
            uVar7 = *(uint32_t *)(puVar8 + sVar20 + 8);
            (dmux->mem_).start_ = sVar20 + 0xc;
            dmux->bgcolor_ = uVar7;
            dmux->loop_count_ = (uint)*(ushort *)(puVar8 + sVar20 + 0xc);
            (dmux->mem_).start_ = (uVar16 - 6) + sVar20 + 0xe;
            bVar11 = true;
            goto LAB_0010759c;
          }
        }
LAB_0010759e:
        sVar20 = (dmux->mem_).start_;
        if (sVar20 == (dmux->mem_).riff_end_) {
          return PVar19;
        }
        if ((dmux->mem_).end_ - sVar20 < 8) {
          PVar19 = PARSE_NEED_MORE_DATA;
        }
        if (PVar19 != PARSE_OK) {
          return PVar19;
        }
      } while( true );
    }
  }
  return PARSE_NEED_MORE_DATA;
}

Assistant:

static ParseStatus ParseVP8X(WebPDemuxer* const dmux) {
  MemBuffer* const mem = &dmux->mem_;
  uint32_t vp8x_size;

  if (MemDataSize(mem) < CHUNK_HEADER_SIZE) return PARSE_NEED_MORE_DATA;

  dmux->is_ext_format_ = 1;
  Skip(mem, TAG_SIZE);  // VP8X
  vp8x_size = ReadLE32(mem);
  if (vp8x_size > MAX_CHUNK_PAYLOAD) return PARSE_ERROR;
  if (vp8x_size < VP8X_CHUNK_SIZE) return PARSE_ERROR;
  vp8x_size += vp8x_size & 1;
  if (SizeIsInvalid(mem, vp8x_size)) return PARSE_ERROR;
  if (MemDataSize(mem) < vp8x_size) return PARSE_NEED_MORE_DATA;

  dmux->feature_flags_ = ReadByte(mem);
  Skip(mem, 3);  // Reserved.
  dmux->canvas_width_  = 1 + ReadLE24s(mem);
  dmux->canvas_height_ = 1 + ReadLE24s(mem);
  if (dmux->canvas_width_ * (uint64_t)dmux->canvas_height_ >= MAX_IMAGE_AREA) {
    return PARSE_ERROR;  // image final dimension is too large
  }
  Skip(mem, vp8x_size - VP8X_CHUNK_SIZE);  // skip any trailing data.
  dmux->state_ = WEBP_DEMUX_PARSED_HEADER;

  if (SizeIsInvalid(mem, CHUNK_HEADER_SIZE)) return PARSE_ERROR;
  if (MemDataSize(mem) < CHUNK_HEADER_SIZE) return PARSE_NEED_MORE_DATA;

  return ParseVP8XChunks(dmux);
}